

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

char __thiscall duckdb::Value::GetValueInternal<signed_char>(Value *this)

{
  PhysicalType PVar1;
  byte input;
  uint16_t input_00;
  short input_01;
  uint uVar2;
  uint64_t uVar3;
  TryCast *pTVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  LogicalTypeId LVar8;
  InvalidInputException *pIVar9;
  string *psVar10;
  size_t sVar11;
  NotImplementedException *pNVar12;
  InternalException *pIVar13;
  int64_t iVar14;
  uint64_t uVar15;
  undefined8 uVar16;
  char input_02;
  bool input_03;
  uchar input_04;
  char *__s;
  duckdb *pdVar17;
  undefined1 in_R8B;
  undefined1 auVar18 [12];
  undefined1 auVar19 [16];
  hugeint_t input_05;
  uhugeint_t input_06;
  string_t input_07;
  uhugeint_t input_08;
  string_t input_09;
  unkbyte10 Var20;
  char result;
  LogicalType local_b0;
  Value local_98;
  double local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  string local_40;
  
  if (this->is_null == true) {
    pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Calling GetValueInternal on a value that is NULL","");
    InternalException::InternalException(pIVar13,(string *)&local_98);
    __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar8 = (this->type_).id_;
  switch(LVar8) {
  case BOOLEAN:
    bVar5 = (this->value_).boolean;
    bVar7 = TryCast::Operation<bool,signed_char>(bVar5,(int8_t *)&local_b0,false);
    if (!bVar7) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<bool,signed_char>((string *)&local_98,(duckdb *)(ulong)bVar5,input_03);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case TINYINT:
    cVar6 = (this->value_).tinyint;
    bVar5 = TryCast::Operation<signed_char,signed_char>(cVar6,(int8_t *)&local_b0,false);
    if (!bVar5) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<signed_char,signed_char>
                ((string *)&local_98,(duckdb *)(ulong)(uint)(int)cVar6,input_02);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case SMALLINT:
    input_01 = (this->value_).smallint;
    bVar5 = TryCast::Operation<short,signed_char>(input_01,(int8_t *)&local_b0,false);
    if (!bVar5) {
      Var20 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,signed_char>
                ((string *)&local_98,(duckdb *)(ulong)(uint)(int)input_01,
                 (short)((unkuint10)Var20 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var20,(string *)&local_98);
      __cxa_throw((InvalidInputException *)Var20,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case INTEGER:
    uVar2 = (this->value_).integer;
    bVar5 = TryCast::Operation<int,signed_char>(uVar2,(int8_t *)&local_b0,false);
    if (!bVar5) {
      auVar18 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,signed_char>((string *)&local_98,(duckdb *)(ulong)uVar2,auVar18._8_4_);
      InvalidInputException::InvalidInputException(auVar18._0_8_,(string *)&local_98);
      __cxa_throw(auVar18._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case BIGINT:
    pdVar17 = (duckdb *)(this->value_).bigint;
    bVar5 = TryCast::Operation<long,signed_char>((int64_t)pdVar17,(int8_t *)&local_b0,false);
    if (!bVar5) {
      auVar19 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,signed_char>((string *)&local_98,pdVar17,auVar19._8_8_);
      InvalidInputException::InvalidInputException(auVar19._0_8_,(string *)&local_98);
      __cxa_throw(auVar19._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case DATE:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT32,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_SEC:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_MS:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIMESTAMP_NS:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    LogicalType::LogicalType(&local_b0,DOUBLE);
    DefaultCastAs(&local_98,this,&local_b0,false);
    LVar8 = GetValueInternal<signed_char>(&local_98);
    ~Value(&local_98);
    LogicalType::~LogicalType(&local_b0);
    local_b0.id_ = LVar8;
    break;
  case FLOAT:
    local_58 = (double)CONCAT44(local_58._4_4_,(this->value_).float_);
    pdVar17 = (duckdb *)0x0;
    bVar5 = TryCast::Operation<float,signed_char>((this->value_).float_,(int8_t *)&local_b0,false);
    if (!bVar5) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,signed_char>((string *)&local_98,pdVar17,local_58._0_4_);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case DOUBLE:
    local_58 = (this->value_).double_;
    pdVar17 = (duckdb *)0x0;
    bVar5 = TryCast::Operation<double,signed_char>(local_58,(int8_t *)&local_b0,false);
    if (!bVar5) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,signed_char>((string *)&local_98,pdVar17,local_58);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case VARCHAR:
    psVar10 = StringValue::Get_abi_cxx11_(this);
    __s = (psVar10->_M_dataplus)._M_p;
    sVar11 = strlen(__s);
    local_50 = (uint)sVar11;
    if (local_50 < 0xd) {
      local_44 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      if (local_50 == 0) {
        __s = (char *)0x0;
      }
      else {
        switchD_012b9b0d::default(&uStack_4c,__s,(ulong)(local_50 & 0xf));
        __s = (char *)CONCAT44(local_44,uStack_48);
      }
    }
    else {
      uStack_4c = *(undefined4 *)__s;
    }
    pTVar4 = (TryCast *)CONCAT44(uStack_4c,local_50);
    uVar16 = 0;
    input_09.value.pointer.ptr = (char *)&local_b0;
    input_09.value._0_8_ = __s;
    bVar5 = TryCast::Operation<duckdb::string_t,signed_char>
                      (pTVar4,input_09,(int8_t *)0x0,(bool)in_R8B);
    if (!bVar5) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_07.value.pointer.ptr = (char *)uVar16;
      input_07.value._0_8_ = __s;
      CastExceptionText<duckdb::string_t,signed_char>((string *)&local_98,(duckdb *)pTVar4,input_07)
      ;
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case INTERVAL:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INTERVAL,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UTINYINT:
    input = (this->value_).utinyint;
    bVar5 = TryCast::Operation<unsigned_char,signed_char>(input,(int8_t *)&local_b0,false);
    if (!bVar5) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_char,signed_char>
                ((string *)&local_98,(duckdb *)(ulong)input,input_04);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case USMALLINT:
    input_00 = (this->value_).usmallint;
    bVar5 = TryCast::Operation<unsigned_short,signed_char>(input_00,(int8_t *)&local_b0,false);
    if (!bVar5) {
      Var20 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_short,signed_char>
                ((string *)&local_98,(duckdb *)(ulong)input_00,
                 (unsigned_short)((unkuint10)Var20 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var20,(string *)&local_98);
      __cxa_throw((InvalidInputException *)Var20,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case UINTEGER:
    uVar2 = (this->value_).uinteger;
    bVar5 = TryCast::Operation<unsigned_int,signed_char>(uVar2,(int8_t *)&local_b0,false);
    if (!bVar5) {
      auVar18 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_int,signed_char>
                ((string *)&local_98,(duckdb *)(ulong)uVar2,auVar18._8_4_);
      InvalidInputException::InvalidInputException(auVar18._0_8_,(string *)&local_98);
      __cxa_throw(auVar18._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case UBIGINT:
    pdVar17 = (duckdb *)(this->value_).ubigint;
    bVar5 = TryCast::Operation<unsigned_long,signed_char>
                      ((uint64_t)pdVar17,(int8_t *)&local_b0,false);
    if (!bVar5) {
      auVar19 = __cxa_allocate_exception(0x10);
      CastExceptionText<unsigned_long,signed_char>((string *)&local_98,pdVar17,auVar19._8_8_);
      InvalidInputException::InvalidInputException(auVar19._0_8_,(string *)&local_98);
      __cxa_throw(auVar19._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    break;
  case TIMESTAMP_TZ:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INT64,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TIME_TZ:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b0._0_8_ = (element_type *)0x26;
    local_98.type_._0_8_ = ::std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_b0);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._0_8_;
    builtin_strncpy((char *)local_98.type_._0_8_,"Unimplemented type for cast (%s -> %s)",0x26);
    local_98.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_b0._0_8_;
    *(char *)(local_98.type_._0_8_ + local_b0._0_8_) = '\0';
    NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
              (pNVar12,(string *)&local_98,INVALID,INT8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case UHUGEINT:
    pTVar4 = *(TryCast **)&this->value_;
    uVar3 = (this->value_).hugeint.upper;
    uVar15 = 0;
    input_08.upper = (uint64_t)&local_b0;
    input_08.lower = uVar3;
    bVar5 = TryCast::Operation<duckdb::uhugeint_t,signed_char>
                      (pTVar4,input_08,(int8_t *)0x0,(bool)in_R8B);
    if (!bVar5) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_06.upper = uVar15;
      input_06.lower = uVar3;
      CastExceptionText<duckdb::uhugeint_t,signed_char>
                ((string *)&local_98,(duckdb *)pTVar4,input_06);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case HUGEINT:
  case UUID:
    pdVar17 = (duckdb *)(this->value_).hugeint.lower;
    uVar3 = (this->value_).hugeint.upper;
    iVar14 = 0;
    bVar5 = TryCast::Operation<duckdb::hugeint_t,signed_char>
                      ((this->value_).hugeint,(int8_t *)&local_b0,false);
    if (!bVar5) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_05.upper = iVar14;
      input_05.lower = uVar3;
      CastExceptionText<duckdb::hugeint_t,signed_char>((string *)&local_98,pdVar17,input_05);
      InvalidInputException::InvalidInputException(pIVar9,(string *)&local_98);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  default:
    if (LVar8 == ENUM) {
      PVar1 = (this->type_).physical_type_;
      if (PVar1 == UINT32) {
        cVar6 = Cast::Operation<unsigned_int,signed_char>((this->value_).uinteger);
        return cVar6;
      }
      if (PVar1 == UINT16) {
        cVar6 = Cast::Operation<unsigned_short,signed_char>((this->value_).usmallint);
        return cVar6;
      }
      if (PVar1 != UINT8) {
        pIVar13 = (InternalException *)__cxa_allocate_exception(0x10);
        local_98.type_._0_8_ =
             &local_98.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid Internal Type for ENUMs","");
        InternalException::InternalException(pIVar13,(string *)&local_98);
        __cxa_throw(pIVar13,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      cVar6 = Cast::Operation<unsigned_char,signed_char>((this->value_).utinyint);
      return cVar6;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_98.type_._0_8_ =
         &local_98.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Unimplemented type \"%s\" for GetValue()","");
    LogicalType::ToString_abi_cxx11_(&local_40,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (pNVar12,(string *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return local_b0.id_;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}